

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O2

int bio_fwrite_1d(void *arr,size_t e_sz,uint32 d1,FILE *fp,uint32 *chksum)

{
  int32 iVar1;
  char *fmt;
  long ln;
  ulong uVar2;
  uint32 d1_local;
  
  d1_local = d1;
  iVar1 = bio_fwrite(&d1_local,4,1,fp,0,chksum);
  if (iVar1 == 1) {
    uVar2 = (ulong)d1_local;
    iVar1 = bio_fwrite(arr,(int32)e_sz,d1_local,fp,0,chksum);
    if ((long)iVar1 == uVar2) {
      return iVar1;
    }
    if (iVar1 == 0) {
      fmt = "Unable to write complete data";
      ln = 0x244;
    }
    else {
      fmt = "OS error in bio_fwrite_1d";
      ln = 0x247;
    }
  }
  else if (iVar1 == 0) {
    fmt = "Unable to write complete data";
    ln = 0x239;
  }
  else {
    fmt = "OS error in bio_fwrite_1d";
    ln = 0x23c;
  }
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                 ,ln,fmt);
  return -1;
}

Assistant:

int
bio_fwrite_1d(void *arr,
	   size_t e_sz,
	   uint32 d1,
	   FILE *fp,
	   uint32 *chksum)
{
    size_t ret;
    ret = bio_fwrite(&d1, sizeof(uint32), 1, fp, 0, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to write complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fwrite_1d");
	}
	return -1;
    }

    ret = bio_fwrite(arr, e_sz, d1, fp, 0, chksum);
    if (ret != d1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to write complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fwrite_1d");
	}

	return -1;
    }

    return ret;
}